

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

void Abc_GraphPathPrint4(int *pBuffer,Vec_Int_t *vEdges)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  undefined1 *puVar9;
  undefined1 uVar10;
  uint uVar11;
  ulong uVar12;
  char Box [13] [13];
  undefined1 local_e8;
  undefined1 local_e7 [12];
  undefined1 local_db [171];
  
  puVar4 = &local_e8;
  puVar9 = &local_e8;
  uVar1 = vEdges->nSize;
  lVar6 = 0;
  do {
    lVar8 = 0;
    do {
      uVar10 = 0x2a;
      if ((((uint)lVar8 | (uint)lVar6) & 3) != 0) {
        uVar10 = 0x20;
      }
      puVar4[lVar8] = uVar10;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xd);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 0xd;
  } while (lVar6 != 0xd);
  if (1 < (int)uVar1) {
    uVar12 = 0;
    do {
      if ((ulong)uVar1 <= uVar12 * 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar3 = vEdges->pArray[uVar12 * 2];
      uVar2 = vEdges->pArray[uVar12 * 2 + 1];
      uVar5 = uVar3 + 3;
      if (-1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      uVar11 = uVar2 + 3;
      if (-1 < (int)uVar2) {
        uVar11 = uVar2;
      }
      if (pBuffer[uVar12] != 0) {
        uVar5 = uVar5 & 0xfffffffc;
        uVar7 = (int)uVar3 % 4 << 2;
        uVar11 = uVar11 & 0xfffffffc;
        uVar3 = ((int)uVar2 % 4) * 4;
        if (uVar5 == uVar11) {
          if ((int)(uVar7 | 1) < (int)uVar3) {
            memset(local_e7 + (long)(int)uVar7 + (long)(int)uVar5 * 0xd,0x2d,(ulong)(~uVar7 + uVar3)
                  );
          }
        }
        else {
          if (uVar7 != uVar3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                          ,0xd2,"void Abc_GraphPathPrint4(int *, Vec_Int_t *)");
          }
          if ((int)(uVar5 | 1) < (int)uVar11) {
            puVar4 = local_db + (long)(int)uVar5 * 0xd + (long)(int)uVar7;
            lVar6 = ~(long)(int)uVar5 + (long)(int)uVar11;
            do {
              *puVar4 = 0x7c;
              puVar4 = puVar4 + 0xd;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1 >> 1);
  }
  lVar6 = 0;
  do {
    lVar8 = -0xd;
    do {
      putchar((int)(char)puVar9[lVar8 + 0xd]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    lVar6 = lVar6 + 1;
    putchar(10);
    puVar9 = puVar9 + 0xd;
  } while (lVar6 != 0xd);
  puts("\n\n=================================\n");
  return;
}

Assistant:

void Abc_GraphPathPrint4( int * pBuffer, Vec_Int_t * vEdges )
{
    char Box[13][13];
    int x, y;
    int e, nEdges = Vec_IntSize(vEdges)/2;
    for ( y = 0; y < 13; y++ )
    for ( x = 0; x < 13; x++ )
        if ( y % 4 == 0 && x % 4 == 0 )
            Box[y][x] = '*';
        else
            Box[y][x] = ' ';
    for ( e = 0; e < nEdges; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        int y0 = 4*(pNodes[0]/4);
        int x0 = 4*(pNodes[0]%4);
        int y1 = 4*(pNodes[1]/4);
        int x1 = 4*(pNodes[1]%4);
        if ( !pBuffer[e] )
            continue;
        if ( y0 == y1 )
        {
            for ( x = x0+1; x < x1; x++ )
                Box[y0][x] = '-';
        }
        else if ( x0 == x1 )
        {
            for ( y = y0+1; y < y1; y++ )
                Box[y][x0] = '|';
        }
        else assert( 0 );
    }
    for ( y = 0; y < 13; y++, printf("\n") )
    for ( x = 0; x < 13; x++ )
        printf( "%c", Box[y][x] );
    printf( "\n\n=================================\n\n" );
}